

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# png.c
# Opt level: O2

void png_free_data(png_const_structrp png_ptr,png_inforp info_ptr,png_uint_32 mask,int num)

{
  byte *pbVar1;
  png_sPLT_tp ppVar2;
  uint uVar3;
  uint uVar4;
  int i_1;
  ulong uVar5;
  long lVar6;
  int i;
  long lVar7;
  
  if (info_ptr != (png_inforp)0x0 && png_ptr != (png_const_structrp)0x0) {
    if ((info_ptr->text != (png_textp)0x0) && (((info_ptr->free_me & mask) >> 0xe & 1) != 0)) {
      if (num == -1) {
        lVar6 = 8;
        for (lVar7 = 0; lVar7 < info_ptr->num_text; lVar7 = lVar7 + 1) {
          png_free(png_ptr,*(png_voidp *)((long)&info_ptr->text->compression + lVar6));
          lVar6 = lVar6 + 0x38;
        }
        png_free(png_ptr,info_ptr->text);
        info_ptr->text = (png_textp)0x0;
        info_ptr->num_text = 0;
        info_ptr->max_text = 0;
      }
      else {
        png_free(png_ptr,info_ptr->text[num].key);
        info_ptr->text[num].key = (png_charp)0x0;
      }
    }
    uVar3 = info_ptr->free_me;
    if (((mask & uVar3) >> 0xd & 1) != 0) {
      *(byte *)&info_ptr->valid = (byte)info_ptr->valid & 0xef;
      png_free(png_ptr,info_ptr->trans_alpha);
      info_ptr->trans_alpha = (png_bytep)0x0;
      info_ptr->num_trans = 0;
      uVar3 = info_ptr->free_me;
    }
    if (((mask & uVar3) >> 8 & 1) != 0) {
      png_free(png_ptr,info_ptr->scal_s_width);
      png_free(png_ptr,info_ptr->scal_s_height);
      info_ptr->scal_s_width = (png_charp)0x0;
      info_ptr->scal_s_height = (png_charp)0x0;
      pbVar1 = (byte *)((long)&info_ptr->valid + 1);
      *pbVar1 = *pbVar1 & 0xbf;
      uVar3 = info_ptr->free_me;
    }
    if ((char)((byte)mask & (byte)uVar3) < '\0') {
      png_free(png_ptr,info_ptr->pcal_purpose);
      png_free(png_ptr,info_ptr->pcal_units);
      info_ptr->pcal_purpose = (png_charp)0x0;
      info_ptr->pcal_units = (png_charp)0x0;
      if (info_ptr->pcal_params != (png_charpp)0x0) {
        for (uVar5 = 0; uVar5 < info_ptr->pcal_nparams; uVar5 = uVar5 + 1) {
          png_free(png_ptr,info_ptr->pcal_params[uVar5]);
        }
        png_free(png_ptr,info_ptr->pcal_params);
        info_ptr->pcal_params = (png_charpp)0x0;
      }
      pbVar1 = (byte *)((long)&info_ptr->valid + 1);
      *pbVar1 = *pbVar1 & 0xfb;
      uVar3 = info_ptr->free_me;
    }
    if ((uVar3 & mask & 0x10) != 0) {
      png_free(png_ptr,info_ptr->iccp_name);
      png_free(png_ptr,info_ptr->iccp_profile);
      info_ptr->iccp_name = (png_charp)0x0;
      info_ptr->iccp_profile = (png_bytep)0x0;
      pbVar1 = (byte *)((long)&info_ptr->valid + 1);
      *pbVar1 = *pbVar1 & 0xef;
    }
    if ((info_ptr->splt_palettes != (png_sPLT_tp)0x0) && ((info_ptr->free_me & mask & 0x20) != 0)) {
      if (num == -1) {
        lVar7 = 0;
        for (lVar6 = 0; lVar6 < info_ptr->splt_palettes_num; lVar6 = lVar6 + 1) {
          png_free(png_ptr,*(png_voidp *)((long)&info_ptr->splt_palettes->name + lVar7));
          png_free(png_ptr,*(png_voidp *)((long)&info_ptr->splt_palettes->entries + lVar7));
          lVar7 = lVar7 + 0x20;
        }
        png_free(png_ptr,info_ptr->splt_palettes);
        info_ptr->splt_palettes = (png_sPLT_tp)0x0;
        info_ptr->splt_palettes_num = 0;
        pbVar1 = (byte *)((long)&info_ptr->valid + 1);
        *pbVar1 = *pbVar1 & 0xdf;
      }
      else {
        png_free(png_ptr,info_ptr->splt_palettes[num].name);
        png_free(png_ptr,info_ptr->splt_palettes[num].entries);
        ppVar2 = info_ptr->splt_palettes;
        ppVar2[num].name = (png_charp)0x0;
        ppVar2[num].entries = (png_sPLT_entryp)0x0;
      }
    }
    if ((info_ptr->unknown_chunks != (png_unknown_chunkp)0x0) &&
       (((info_ptr->free_me & mask) >> 9 & 1) != 0)) {
      if (num == -1) {
        lVar6 = 8;
        for (lVar7 = 0; lVar7 < info_ptr->unknown_chunks_num; lVar7 = lVar7 + 1) {
          png_free(png_ptr,*(png_voidp *)(info_ptr->unknown_chunks->name + lVar6));
          lVar6 = lVar6 + 0x20;
        }
        png_free(png_ptr,info_ptr->unknown_chunks);
        info_ptr->unknown_chunks = (png_unknown_chunkp)0x0;
        info_ptr->unknown_chunks_num = 0;
      }
      else {
        png_free(png_ptr,info_ptr->unknown_chunks[num].data);
        info_ptr->unknown_chunks[num].data = (png_byte *)0x0;
      }
    }
    uVar3 = info_ptr->free_me;
    if ((short)((ushort)mask & (ushort)uVar3) < 0) {
      if (info_ptr->exif != (png_bytep)0x0) {
        png_free(png_ptr,info_ptr->exif);
        info_ptr->exif = (png_bytep)0x0;
        uVar3 = info_ptr->free_me;
      }
      pbVar1 = (byte *)((long)&info_ptr->valid + 2);
      *pbVar1 = *pbVar1 & 0xfe;
    }
    if ((mask & uVar3 & 8) != 0) {
      png_free(png_ptr,info_ptr->hist);
      info_ptr->hist = (png_uint_16p)0x0;
      *(byte *)&info_ptr->valid = (byte)info_ptr->valid & 0xbf;
      uVar3 = info_ptr->free_me;
    }
    if (((mask & uVar3) >> 0xc & 1) != 0) {
      png_free(png_ptr,info_ptr->palette);
      info_ptr->palette = (png_colorp)0x0;
      *(byte *)&info_ptr->valid = (byte)info_ptr->valid & 0xf7;
      info_ptr->num_palette = 0;
      uVar3 = info_ptr->free_me;
    }
    if ((mask & uVar3 & 0x40) != 0) {
      if (info_ptr->row_pointers != (png_bytepp)0x0) {
        for (uVar5 = 0; uVar5 < info_ptr->height; uVar5 = uVar5 + 1) {
          png_free(png_ptr,info_ptr->row_pointers[uVar5]);
        }
        png_free(png_ptr,info_ptr->row_pointers);
        info_ptr->row_pointers = (png_bytepp)0x0;
        uVar3 = info_ptr->free_me;
      }
      pbVar1 = (byte *)((long)&info_ptr->valid + 1);
      *pbVar1 = *pbVar1 & 0x7f;
    }
    uVar4 = mask & 0xffffbddf;
    if (num == -1) {
      uVar4 = mask;
    }
    info_ptr->free_me = ~uVar4 & uVar3;
  }
  return;
}

Assistant:

void PNGAPI
png_free_data(png_const_structrp png_ptr, png_inforp info_ptr, png_uint_32 mask,
    int num)
{
   png_debug(1, "in png_free_data");

   if (png_ptr == NULL || info_ptr == NULL)
      return;

#ifdef PNG_TEXT_SUPPORTED
   /* Free text item num or (if num == -1) all text items */
   if (info_ptr->text != NULL &&
       ((mask & PNG_FREE_TEXT) & info_ptr->free_me) != 0)
   {
      if (num != -1)
      {
         png_free(png_ptr, info_ptr->text[num].key);
         info_ptr->text[num].key = NULL;
      }

      else
      {
         int i;

         for (i = 0; i < info_ptr->num_text; i++)
            png_free(png_ptr, info_ptr->text[i].key);

         png_free(png_ptr, info_ptr->text);
         info_ptr->text = NULL;
         info_ptr->num_text = 0;
         info_ptr->max_text = 0;
      }
   }
#endif

#ifdef PNG_tRNS_SUPPORTED
   /* Free any tRNS entry */
   if (((mask & PNG_FREE_TRNS) & info_ptr->free_me) != 0)
   {
      info_ptr->valid &= ~PNG_INFO_tRNS;
      png_free(png_ptr, info_ptr->trans_alpha);
      info_ptr->trans_alpha = NULL;
      info_ptr->num_trans = 0;
   }
#endif

#ifdef PNG_sCAL_SUPPORTED
   /* Free any sCAL entry */
   if (((mask & PNG_FREE_SCAL) & info_ptr->free_me) != 0)
   {
      png_free(png_ptr, info_ptr->scal_s_width);
      png_free(png_ptr, info_ptr->scal_s_height);
      info_ptr->scal_s_width = NULL;
      info_ptr->scal_s_height = NULL;
      info_ptr->valid &= ~PNG_INFO_sCAL;
   }
#endif

#ifdef PNG_pCAL_SUPPORTED
   /* Free any pCAL entry */
   if (((mask & PNG_FREE_PCAL) & info_ptr->free_me) != 0)
   {
      png_free(png_ptr, info_ptr->pcal_purpose);
      png_free(png_ptr, info_ptr->pcal_units);
      info_ptr->pcal_purpose = NULL;
      info_ptr->pcal_units = NULL;

      if (info_ptr->pcal_params != NULL)
         {
            int i;

            for (i = 0; i < info_ptr->pcal_nparams; i++)
               png_free(png_ptr, info_ptr->pcal_params[i]);

            png_free(png_ptr, info_ptr->pcal_params);
            info_ptr->pcal_params = NULL;
         }
      info_ptr->valid &= ~PNG_INFO_pCAL;
   }
#endif

#ifdef PNG_iCCP_SUPPORTED
   /* Free any profile entry */
   if (((mask & PNG_FREE_ICCP) & info_ptr->free_me) != 0)
   {
      png_free(png_ptr, info_ptr->iccp_name);
      png_free(png_ptr, info_ptr->iccp_profile);
      info_ptr->iccp_name = NULL;
      info_ptr->iccp_profile = NULL;
      info_ptr->valid &= ~PNG_INFO_iCCP;
   }
#endif

#ifdef PNG_sPLT_SUPPORTED
   /* Free a given sPLT entry, or (if num == -1) all sPLT entries */
   if (info_ptr->splt_palettes != NULL &&
       ((mask & PNG_FREE_SPLT) & info_ptr->free_me) != 0)
   {
      if (num != -1)
      {
         png_free(png_ptr, info_ptr->splt_palettes[num].name);
         png_free(png_ptr, info_ptr->splt_palettes[num].entries);
         info_ptr->splt_palettes[num].name = NULL;
         info_ptr->splt_palettes[num].entries = NULL;
      }

      else
      {
         int i;

         for (i = 0; i < info_ptr->splt_palettes_num; i++)
         {
            png_free(png_ptr, info_ptr->splt_palettes[i].name);
            png_free(png_ptr, info_ptr->splt_palettes[i].entries);
         }

         png_free(png_ptr, info_ptr->splt_palettes);
         info_ptr->splt_palettes = NULL;
         info_ptr->splt_palettes_num = 0;
         info_ptr->valid &= ~PNG_INFO_sPLT;
      }
   }
#endif

#ifdef PNG_STORE_UNKNOWN_CHUNKS_SUPPORTED
   if (info_ptr->unknown_chunks != NULL &&
       ((mask & PNG_FREE_UNKN) & info_ptr->free_me) != 0)
   {
      if (num != -1)
      {
          png_free(png_ptr, info_ptr->unknown_chunks[num].data);
          info_ptr->unknown_chunks[num].data = NULL;
      }

      else
      {
         int i;

         for (i = 0; i < info_ptr->unknown_chunks_num; i++)
            png_free(png_ptr, info_ptr->unknown_chunks[i].data);

         png_free(png_ptr, info_ptr->unknown_chunks);
         info_ptr->unknown_chunks = NULL;
         info_ptr->unknown_chunks_num = 0;
      }
   }
#endif

#ifdef PNG_eXIf_SUPPORTED
   /* Free any eXIf entry */
   if (((mask & PNG_FREE_EXIF) & info_ptr->free_me) != 0)
   {
      if (info_ptr->exif)
      {
         png_free(png_ptr, info_ptr->exif);
         info_ptr->exif = NULL;
      }
      info_ptr->valid &= ~PNG_INFO_eXIf;
   }
#endif

#ifdef PNG_hIST_SUPPORTED
   /* Free any hIST entry */
   if (((mask & PNG_FREE_HIST) & info_ptr->free_me) != 0)
   {
      png_free(png_ptr, info_ptr->hist);
      info_ptr->hist = NULL;
      info_ptr->valid &= ~PNG_INFO_hIST;
   }
#endif

   /* Free any PLTE entry that was internally allocated */
   if (((mask & PNG_FREE_PLTE) & info_ptr->free_me) != 0)
   {
      png_free(png_ptr, info_ptr->palette);
      info_ptr->palette = NULL;
      info_ptr->valid &= ~PNG_INFO_PLTE;
      info_ptr->num_palette = 0;
   }

#ifdef PNG_INFO_IMAGE_SUPPORTED
   /* Free any image bits attached to the info structure */
   if (((mask & PNG_FREE_ROWS) & info_ptr->free_me) != 0)
   {
      if (info_ptr->row_pointers != NULL)
      {
         png_uint_32 row;
         for (row = 0; row < info_ptr->height; row++)
            png_free(png_ptr, info_ptr->row_pointers[row]);

         png_free(png_ptr, info_ptr->row_pointers);
         info_ptr->row_pointers = NULL;
      }
      info_ptr->valid &= ~PNG_INFO_IDAT;
   }
#endif

   if (num != -1)
      mask &= ~PNG_FREE_MUL;

   info_ptr->free_me &= ~mask;
}